

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1d6630d::GetSseSum16x16DualTest_DISABLED_Speed_Test::TestBody
          (GetSseSum16x16DualTest_DISABLED_Speed_Test *this)

{
  ACMRandom *this_00;
  int iVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  int64_t iVar5;
  int col_1;
  int col;
  long lVar6;
  int idx;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  int sum_tot_simd;
  uint sse_tot_simd;
  int64_t local_80;
  uint var2 [2];
  uint var1 [2];
  uint sse2 [2];
  uint sse1 [2];
  int sum_tot_c;
  uint sse_tot_c;
  aom_usec_timer timer;
  
  iVar1 = (this->super_GetSseSum16x16DualTest).params_.block_size;
  this_00 = &(this->super_GetSseSum16x16DualTest).rnd_;
  iVar3 = iVar1;
  for (lVar7 = 0; lVar7 < iVar3; lVar7 = lVar7 + 1) {
    uVar2 = libaom_test::ACMRandom::Rand8(this_00);
    (this->super_GetSseSum16x16DualTest).src_[lVar7] = uVar2;
    uVar2 = libaom_test::ACMRandom::Rand8(this_00);
    (this->super_GetSseSum16x16DualTest).ref_[lVar7] = uVar2;
    iVar3 = (this->super_GetSseSum16x16DualTest).params_.block_size;
  }
  iVar3 = (int)(1000000000 / (long)iVar1);
  sse1[0] = 0;
  sse1[1] = 0;
  sse2[0] = 0;
  sse2[1] = 0;
  var1[0] = 0;
  var1[1] = 0;
  var2[0] = 0;
  var2[1] = 0;
  sse_tot_c = 0;
  sse_tot_simd = 0;
  sum_tot_c = 0;
  sum_tot_simd = 0;
  iVar1 = (this->super_GetSseSum16x16DualTest).params_.width;
  ::aom_usec_timer_start(&timer);
  if (iVar3 < 1) {
    iVar3 = 0;
  }
  for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
    lVar9 = 0;
    for (lVar7 = 0; lVar7 < (this->super_GetSseSum16x16DualTest).params_.height;
        lVar7 = lVar7 + 0x10) {
      lVar8 = lVar9;
      for (lVar6 = 0; lVar6 < (this->super_GetSseSum16x16DualTest).params_.width;
          lVar6 = lVar6 + 0x20) {
        aom_get_var_sse_sum_16x16_dual_c
                  ((this->super_GetSseSum16x16DualTest).src_ + lVar8,iVar1,
                   (this->super_GetSseSum16x16DualTest).ref_ + lVar8,iVar1,sse2,&sse_tot_c,
                   &sum_tot_c,var2);
        lVar8 = lVar8 + 0x20;
      }
      lVar9 = lVar9 + (long)iVar1 * 0x10;
    }
  }
  ::aom_usec_timer_mark(&timer);
  local_80 = ::aom_usec_timer_elapsed(&timer);
  ::aom_usec_timer_start(&timer);
  for (iVar4 = 0; iVar4 != iVar3; iVar4 = iVar4 + 1) {
    lVar9 = 0;
    for (lVar7 = 0; lVar7 < (this->super_GetSseSum16x16DualTest).params_.height;
        lVar7 = lVar7 + 0x10) {
      lVar8 = lVar9;
      for (lVar6 = 0; lVar6 < (this->super_GetSseSum16x16DualTest).params_.width;
          lVar6 = lVar6 + 0x20) {
        (*(this->super_GetSseSum16x16DualTest).params_.func)
                  ((this->super_GetSseSum16x16DualTest).src_ + lVar8,iVar1,
                   (this->super_GetSseSum16x16DualTest).ref_ + lVar8,iVar1,sse1,&sse_tot_simd,
                   &sum_tot_simd,var1);
        lVar8 = lVar8 + 0x20;
      }
      lVar9 = lVar9 + (long)iVar1 * 0x10;
    }
  }
  dVar10 = (double)local_80;
  ::aom_usec_timer_mark(&timer);
  iVar5 = ::aom_usec_timer_elapsed(&timer);
  printf("aom_getvar_16x16_dual for block=%dx%d : ref_time=%lf \t simd_time=%lf \t gain=%lf \n",
         dVar10,(double)iVar5,dVar10 / (double)iVar5,
         (ulong)(uint)(this->super_GetSseSum16x16DualTest).params_.width,
         (ulong)(uint)(this->super_GetSseSum16x16DualTest).params_.height);
  return;
}

Assistant:

TEST_P(GetSseSum16x16DualTest, DISABLED_Speed) { SseSum_SpeedTestDual(); }